

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O1

int __thiscall
CVmObjIterIdx::getp_get_cur_key(CVmObjIterIdx *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  
  if (getp_get_cur_key(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_cur_key();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_cur_key::desc);
  if (iVar3 == 0) {
    pcVar2 = (this->super_CVmObjIter).super_CVmObject.ext_;
    uVar1 = *(uint *)(pcVar2 + 5);
    if ((uVar1 == 0) || (*(uint *)(pcVar2 + 0xd) < uVar1)) {
      err_throw(0x7eb);
    }
    retval->typ = VM_INT;
    (retval->val).obj = uVar1;
  }
  return 1;
}

Assistant:

int CVmObjIterIdx::getp_get_cur_key(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                    uint *argc)
{
    long idx;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the current index */
    idx = get_cur_index();

    /* if the current value is out of range, throw an error */
    if (idx < 1 || idx > get_last_valid())
        err_throw(VMERR_OUT_OF_RANGE);

    /* return the index */
    retval->set_int(idx);

    /* handled */
    return TRUE;
}